

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_texture_op(CompilerGLSL *this,Instruction *i,bool sparse)

{
  uint32_t *puVar1;
  uint *puVar2;
  uint32_t id_00;
  uint *inherit;
  uint *__end1;
  uint *__begin1;
  SmallVector<unsigned_int,_8UL> *__range1;
  undefined1 local_130 [64];
  spirv_cross local_f0 [32];
  undefined1 local_d0 [40];
  string expr;
  byte local_8d;
  uint32_t local_8c;
  uint32_t uStack_88;
  bool forward;
  uint32_t sparse_texel_id;
  uint32_t sparse_code_id;
  SPIRType *local_78;
  SPIRType *return_type;
  uint32_t id;
  uint32_t result_type_id;
  SmallVector<unsigned_int,_8UL> inherited_expressions;
  Op op;
  uint32_t *ops;
  bool sparse_local;
  Instruction *i_local;
  CompilerGLSL *this_local;
  
  puVar1 = Compiler::stream(&this->super_Compiler,i);
  inherited_expressions.stack_storage.aligned_char._28_4_ = ZEXT24(i->op);
  SmallVector<unsigned_int,_8UL>::SmallVector((SmallVector<unsigned_int,_8UL> *)&id);
  return_type._4_4_ = *puVar1;
  return_type._0_4_ = puVar1[1];
  local_78 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,return_type._4_4_);
  uStack_88 = 0;
  local_8c = 0;
  if (sparse) {
    emit_sparse_feedback_temporaries
              (this,return_type._4_4_,(uint32_t)return_type,&stack0xffffffffffffff78,&local_8c);
  }
  local_8d = 0;
  (*(this->super_Compiler)._vptr_Compiler[0x11])
            (local_d0 + 0x20,this,i,(ulong)(sparse & 1),&local_8d);
  if (sparse) {
    id_00 = (uint32_t)this;
    to_expression_abi_cxx11_((CompilerGLSL *)local_d0,id_00,SUB41(uStack_88,0));
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
               (char (*) [4])0x4f38c2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_d0 + 0x20),(char (*) [2])0x4d9ce2);
    ::std::__cxx11::string::~string((string *)local_d0);
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_130 + 0x20,this,local_78,0);
    to_expression_abi_cxx11_((CompilerGLSL *)local_130,id_00,SUB41(uStack_88,0));
    to_expression_abi_cxx11_((CompilerGLSL *)&__range1,id_00,SUB41(local_8c,0));
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              (local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_130 + 0x20),(char (*) [2])0x4f3f9c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
               (char (*) [3])0x4f06f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
               (char (*) [2])0x4dff7a);
    ::std::__cxx11::string::operator=((string *)(local_d0 + 0x20),(string *)local_f0);
    ::std::__cxx11::string::~string((string *)local_f0);
    ::std::__cxx11::string::~string((string *)&__range1);
    ::std::__cxx11::string::~string((string *)local_130);
    ::std::__cxx11::string::~string((string *)(local_130 + 0x20));
    local_8d = 1;
    SmallVector<unsigned_int,_8UL>::clear((SmallVector<unsigned_int,_8UL> *)&id);
  }
  emit_op(this,return_type._4_4_,(uint32_t)return_type,(string *)(local_d0 + 0x20),
          (bool)(local_8d & 1),false);
  __end1 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)&id);
  puVar2 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)&id);
  for (; __end1 != puVar2; __end1 = __end1 + 1) {
    Compiler::inherit_expression_dependencies(&this->super_Compiler,(uint32_t)return_type,*__end1);
  }
  if ((((inherited_expressions.stack_storage.aligned_char._28_4_ == 0x57) ||
       (inherited_expressions.stack_storage.aligned_char._28_4_ == 0x59)) ||
      (inherited_expressions.stack_storage.aligned_char._28_4_ == 0x5b)) ||
     (inherited_expressions.stack_storage.aligned_char._28_4_ == 0x5d)) {
    register_control_dependent_expression(this,(uint32_t)return_type);
  }
  ::std::__cxx11::string::~string((string *)(local_d0 + 0x20));
  SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)&id);
  return;
}

Assistant:

void CompilerGLSL::emit_texture_op(const Instruction &i, bool sparse)
{
	auto *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	SmallVector<uint32_t> inherited_expressions;

	uint32_t result_type_id = ops[0];
	uint32_t id = ops[1];
	auto &return_type = get<SPIRType>(result_type_id);

	uint32_t sparse_code_id = 0;
	uint32_t sparse_texel_id = 0;
	if (sparse)
		emit_sparse_feedback_temporaries(result_type_id, id, sparse_code_id, sparse_texel_id);

	bool forward = false;
	string expr = to_texture_op(i, sparse, &forward, inherited_expressions);

	if (sparse)
	{
		statement(to_expression(sparse_code_id), " = ", expr, ";");
		expr = join(type_to_glsl(return_type), "(", to_expression(sparse_code_id), ", ", to_expression(sparse_texel_id),
		            ")");
		forward = true;
		inherited_expressions.clear();
	}

	emit_op(result_type_id, id, expr, forward);
	for (auto &inherit : inherited_expressions)
		inherit_expression_dependencies(id, inherit);

	// Do not register sparse ops as control dependent as they are always lowered to a temporary.
	switch (op)
	{
	case OpImageSampleDrefImplicitLod:
	case OpImageSampleImplicitLod:
	case OpImageSampleProjImplicitLod:
	case OpImageSampleProjDrefImplicitLod:
		register_control_dependent_expression(id);
		break;

	default:
		break;
	}
}